

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckBuilder.cpp
# Opt level: O1

void __thiscall
DeckBuilder::deckShuffler(DeckBuilder *this,list<BlackCard_*,_std::allocator<BlackCard_*>_> *black)

{
  size_t *psVar1;
  BlackCard *pBVar2;
  iterator __position;
  int iVar3;
  _List_node_base *p_Var4;
  long lVar5;
  long lVar6;
  BlackCard **ppBVar7;
  vector<BlackCard_*,_std::allocator<BlackCard_*>_> vect;
  BlackCard **local_38;
  BlackCard **ppBStack_30;
  BlackCard **local_28;
  
  local_38 = (BlackCard **)0x0;
  ppBStack_30 = (BlackCard **)0x0;
  local_28 = (BlackCard **)0x0;
  ppBVar7 = local_38;
  __position._M_current = ppBStack_30;
  for (p_Var4 = (black->super__List_base<BlackCard_*,_std::allocator<BlackCard_*>_>)._M_impl._M_node
                .super__List_node_base._M_next; local_38 = ppBVar7,
      ppBStack_30 = __position._M_current, p_Var4 != (_List_node_base *)black;
      p_Var4 = (((_List_base<BlackCard_*,_std::allocator<BlackCard_*>_> *)&p_Var4->_M_next)->_M_impl
               )._M_node.super__List_node_base._M_next) {
    if (__position._M_current == local_28) {
      std::vector<BlackCard*,std::allocator<BlackCard*>>::_M_realloc_insert<BlackCard*const&>
                ((vector<BlackCard*,std::allocator<BlackCard*>> *)&local_38,__position,
                 (BlackCard **)(p_Var4 + 1));
    }
    else {
      *__position._M_current = (BlackCard *)p_Var4[1]._M_next;
      ppBStack_30 = __position._M_current + 1;
    }
    ppBVar7 = local_38;
    __position._M_current = ppBStack_30;
  }
  if ((ppBVar7 != __position._M_current) && (ppBVar7 + 1 != __position._M_current)) {
    lVar6 = 8;
    do {
      iVar3 = rand();
      lVar5 = (long)iVar3 % ((lVar6 >> 3) + 1);
      if (lVar6 != lVar5 * 8) {
        pBVar2 = *(BlackCard **)((long)ppBVar7 + lVar6);
        *(BlackCard **)((long)ppBVar7 + lVar6) = ppBVar7[lVar5];
        ppBVar7[lVar5] = pBVar2;
      }
      lVar5 = lVar6 + 8;
      lVar6 = lVar6 + 8;
    } while ((BlackCard **)((long)ppBVar7 + lVar5) != __position._M_current);
  }
  std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::clear(black);
  for (ppBVar7 = local_38; ppBVar7 != ppBStack_30; ppBVar7 = ppBVar7 + 1) {
    p_Var4 = (_List_node_base *)operator_new(0x18);
    p_Var4[1]._M_next = (_List_node_base *)*ppBVar7;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    psVar1 = &(black->super__List_base<BlackCard_*,_std::allocator<BlackCard_*>_>)._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
  }
  if (local_38 != (BlackCard **)0x0) {
    operator_delete(local_38,(long)local_28 - (long)local_38);
  }
  return;
}

Assistant:

void DeckBuilder::deckShuffler(list<BlackCard *> *black)
{
	vector<BlackCard *> vect;
	list<BlackCard *>::iterator it;
	for (it = black->begin(); it != black->end(); it++)
		vect.push_back((*it));

	random_shuffle(vect.begin(), vect.end());

	black->clear();

	vector<BlackCard *>::iterator it2;
	for (it2 = vect.begin(); it2 != vect.end(); it2++)
		black->push_back((*it2));
}